

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14e75::FragmentURITest_SelectorRangeToString_Test::TestBody
          (FragmentURITest_SelectorRangeToString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  SelectorRange local_60;
  string local_48;
  SelectorRange *local_28;
  code *local_20;
  
  ktx::SelectorRange::SelectorRange(&local_60,0,0);
  local_20 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
             format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>
  ;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_28;
  fmt.size_ = 0xf;
  fmt.data_ = (char *)0x2;
  local_28 = &local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x16ac75,fmt,args);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_70,"fmt::format(\"{}\", ktx::SelectorRange{0, 0})","\"none\"",&local_48,
             (char (*) [5])"none");
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/test_fragment_uri.cc"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  ktx::SelectorRange::SelectorRange(&local_60,0,1);
  local_20 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
             format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>
  ;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_28;
  fmt_00.size_ = 0xf;
  fmt_00.data_ = (char *)0x2;
  local_28 = &local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x16ac75,fmt_00,args_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            (local_70,"fmt::format(\"{}\", ktx::SelectorRange{0, 1})","\"0\"",&local_48,
             (char (*) [2])0x1736cb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/test_fragment_uri.cc"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  ktx::SelectorRange::SelectorRange(&local_60,10,0xb);
  local_20 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
             format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>
  ;
  args_01.field_1.args_ = in_R9.args_;
  args_01.desc_ = (unsigned_long_long)&local_28;
  fmt_01.size_ = 0xf;
  fmt_01.data_ = (char *)0x2;
  local_28 = &local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x16ac75,fmt_01,args_01);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            (local_70,"fmt::format(\"{}\", ktx::SelectorRange{10, 11})","\"10\"",&local_48,
             (char (*) [3])"10");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/test_fragment_uri.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  ktx::SelectorRange::SelectorRange(&local_60,0,2);
  local_20 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
             format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>
  ;
  args_02.field_1.args_ = in_R9.args_;
  args_02.desc_ = (unsigned_long_long)&local_28;
  fmt_02.size_ = 0xf;
  fmt_02.data_ = (char *)0x2;
  local_28 = &local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x16ac75,fmt_02,args_02);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_70,"fmt::format(\"{}\", ktx::SelectorRange{0, 2})","\"0..1\"",&local_48,
             (char (*) [5])"0..1");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/test_fragment_uri.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  ktx::SelectorRange::SelectorRange(&local_60,10,0xc);
  local_20 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
             format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>
  ;
  args_03.field_1.args_ = in_R9.args_;
  args_03.desc_ = (unsigned_long_long)&local_28;
  fmt_03.size_ = 0xf;
  fmt_03.data_ = (char *)0x2;
  local_28 = &local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x16ac75,fmt_03,args_03);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_70,"fmt::format(\"{}\", ktx::SelectorRange{10, 12})","\"10..11\"",&local_48,
             (char (*) [7])"10..11");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/test_fragment_uri.cc"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  ktx::SelectorRange::SelectorRange(&local_60,0,0xffffffff);
  local_20 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
             format_custom_arg<ktx::SelectorRange,fmt::v10::formatter<ktx::SelectorRange,char,void>>
  ;
  args_04.field_1.args_ = in_R9.args_;
  args_04.desc_ = (unsigned_long_long)&local_28;
  fmt_04.size_ = 0xf;
  fmt_04.data_ = (char *)0x2;
  local_28 = &local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x16ac75,fmt_04,args_04);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_70,"fmt::format(\"{}\", ktx::SelectorRange{0, ktx::RangeEnd})","\"all\"",
             &local_48,(char (*) [4])"all");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_60.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/test_fragment_uri.cc"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TEST_F(FragmentURITest, SelectorRangeToString) {
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 0}), "none");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 1}), "0");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{10, 11}), "10");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 2}), "0..1");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{10, 12}), "10..11");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, ktx::RangeEnd}), "all");
}